

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void * nk_create_panel(nk_context *ctx)

{
  nk_page_element *__s;
  void *pvVar1;
  ulong __n;
  size_t __n_00;
  
  __s = nk_create_page_element(ctx);
  if (__s != (nk_page_element *)0x0) {
    __n = (ulong)__s & 3;
    if (__n == 0) {
      pvVar1 = memset(__s,0,0x1c8);
      return pvVar1;
    }
    __n_00 = -__n + 4;
    memset(__s,0,__n_00);
    memset((void *)((long)__s + __n_00),0,0x1c4);
    memset((void *)((long)__s + -__n + 0x1c8),0,__n);
  }
  return __s;
}

Assistant:

NK_INTERN void*
nk_create_panel(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    elem = nk_create_page_element(ctx);
    if (!elem) return 0;
    nk_zero_struct(*elem);
    return &elem->data.pan;
}